

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O1

ConstantValue * __thiscall
slang::ast::builtins::EnumNextPrevMethod::eval
          (ConstantValue *__return_storage_ptr__,EnumNextPrevMethod *this,EvalContext *context,
          Args *args,SourceRange param_3,SystemCallInfo *param_4)

{
  __index_type _Var1;
  Type *pTVar2;
  logic_t lVar3;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar4;
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *__v;
  ulong uVar5;
  optional<unsigned_int> oVar6;
  _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *__rhs;
  EnumValueSymbol *enumerand;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 this_00;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  sVar7;
  SVInt size;
  SVInt count;
  SVInt offset;
  SVInt one;
  SmallVector<const_slang::ast::EnumValueSymbol_*,_5UL> values;
  ConstantValue val;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_138;
  uint local_130;
  ushort local_12c;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_128;
  uint local_120;
  ushort local_11c;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_118;
  uint local_110;
  ushort local_10c;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_108;
  uint local_100;
  undefined1 local_fc;
  byte local_fb;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_f8;
  uint local_f0;
  byte local_eb;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_e8;
  uint local_e0;
  ushort local_dc;
  ulong local_d8;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_d0;
  uint local_c8;
  byte local_c3;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_c0;
  Type *local_b8;
  EnumNextPrevMethod *local_b0;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *local_a8;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> local_a0;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_98;
  char local_78;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  local_b0 = this;
  Expression::eval((ConstantValue *)&local_58,*args->_M_ptr,context);
  if (local_58._M_index == '\0') {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
     + 0x20) = '\0';
    goto LAB_003f0ede;
  }
  local_e0 = 0x21;
  local_dc = 1;
  local_e8.val = 1;
  SVInt::clearUnusedBits((SVInt *)&local_e8);
  SVInt::SVInt((SVInt *)&local_108,(SVIntStorage *)&local_e8);
  if ((args->_M_extent)._M_extent_value == 2) {
    Expression::eval((ConstantValue *)&local_98,args->_M_ptr[1],context);
    if (local_78 == '\0') {
      *(__index_type *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x20) = '\0';
    }
    else {
      pvVar4 = std::
               get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                         ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_98);
      SVInt::operator=((SVInt *)&local_108,pvVar4);
      SVInt::resize((SVInt *)&local_128,(bitwidth_t)&local_108);
      SVInt::operator=((SVInt *)&local_108,(SVInt *)&local_128);
      if (((0x40 < local_120) || ((local_11c & 0x100) != 0)) &&
         ((EnumValueSymbol *)local_128.val != (EnumValueSymbol *)0x0)) {
        operator_delete__(local_128.pVal);
      }
      local_fc = 1;
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_98);
    if (local_78 != '\0') goto LAB_003f0a9e;
  }
  else {
LAB_003f0a9e:
    local_98._0_8_ = (long)&local_98 + 0x18;
    local_98._8_8_ = (EnumValueSymbol *)0x0;
    local_98._16_8_ = 5;
    pTVar2 = ((*args->_M_ptr)->type).ptr;
    if (pTVar2->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar2);
    }
    pTVar2 = pTVar2->canonical;
    local_a8 = std::
               get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                         ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_58);
    sVar7 = Scope::membersOfType<slang::ast::EnumValueSymbol>((Scope *)&pTVar2[1].super_Symbol.name)
    ;
    local_b8 = pTVar2;
    if (sVar7._M_begin.current.current == sVar7._M_end.current.current) {
      uVar5 = 0;
    }
    else {
      local_d8 = 0;
      local_c0.val = 0;
      do {
        local_a0 = sVar7._M_end.current;
        this_00.val = (uint64_t)sVar7._M_begin.current;
        __v = &EnumValueSymbol::getValue((EnumValueSymbol *)this_00.pVal,(SourceRange)ZEXT816(0))->
               value;
        _Var1 = (__v->
                super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                ).
                super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                ._M_index;
        if (_Var1 == '\0') {
          *(__index_type *)
           ((long)&(__return_storage_ptr__->value).
                   super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           + 0x20) = '\0';
        }
        else {
          pvVar4 = std::
                   get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                             (__v);
          lVar3 = SVInt::operator==(pvVar4,local_a8);
          local_128.val = this_00.val;
          SmallVectorBase<slang::ast::EnumValueSymbol_const*>::
          emplace_back<slang::ast::EnumValueSymbol_const*>
                    ((SmallVectorBase<slang::ast::EnumValueSymbol_const*> *)&local_98,
                     (EnumValueSymbol **)&local_128.pVal);
          local_d8 = local_d8 & 0xff;
          if (lVar3.value != '\0' && (lVar3.value != '@' && lVar3.value != 0x80)) {
            local_d8 = 1;
            context = (EvalContext *)local_c0;
          }
          local_c0.pVal = (uint64_t *)(local_c0.val + 1);
        }
        if (_Var1 == '\0') goto LAB_003f0e8a;
        do {
          this_00 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
                    ((anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(this_00.val + 0x28))->pVal;
          sVar7._M_end.current = local_a0.current;
          sVar7._M_begin.current = (Symbol *)this_00.val;
          if ((EnumValueSymbol *)this_00.val == (EnumValueSymbol *)0x0) break;
        } while ((int)*this_00.pVal != 0xb);
        uVar5 = local_d8;
      } while ((Symbol *)this_00.val != local_a0.current);
    }
    if ((EnumValueSymbol *)local_98._8_8_ == (EnumValueSymbol *)0x0) {
      *(__index_type *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x20) = '\0';
    }
    else if ((uVar5 & 1) == 0) {
      Type::getDefaultValue(__return_storage_ptr__,local_b8);
    }
    else {
      if (local_b0->next == false) {
        SVInt::operator-((SVInt *)&local_128);
        SVInt::operator=((SVInt *)&local_108,(SVInt *)&local_128);
        if (((0x40 < local_120) || ((local_11c & 0x100) != 0)) &&
           ((EnumValueSymbol *)local_128.val != (EnumValueSymbol *)0x0)) {
          operator_delete__(local_128.pVal);
        }
      }
      local_120 = 0x21;
      local_11c = 1;
      local_128.val = local_98._8_8_;
      SVInt::clearUnusedBits((SVInt *)&local_128);
      local_130 = 0x21;
      local_12c = 1;
      local_138 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)context;
      SVInt::clearUnusedBits((SVInt *)&local_138);
      SVInt::operator+((SVInt *)&local_f8,(SVInt *)&local_138);
      if (((0x40 < local_130) || ((local_12c & 0x100) != 0)) &&
         ((EvalContext *)local_138.val != (EvalContext *)0x0)) {
        operator_delete__(local_138.pVal);
      }
      SVInt::operator/((SVInt *)&local_d0,(SVInt *)&local_f8);
      SVInt::operator-((SVInt *)&local_118,(SVInt *)&local_e8);
      SVInt::operator*((SVInt *)&local_138,(SVInt *)&local_118);
      SVInt::operator+=((SVInt *)&local_f8,(SVInt *)&local_138);
      if (((0x40 < local_130) || ((local_12c & 0x100) != 0)) &&
         ((EvalContext *)local_138.val != (EvalContext *)0x0)) {
        operator_delete__(local_138.pVal);
      }
      if (((0x40 < local_110) || ((local_10c & 0x100) != 0)) &&
         ((EnumValueSymbol *)local_118.val != (EnumValueSymbol *)0x0)) {
        operator_delete__(local_118.pVal);
      }
      if (((0x40 < local_c8) || ((local_c3 & 1) != 0)) && ((void *)local_d0.val != (void *)0x0)) {
        operator_delete__(local_d0.pVal);
      }
      local_110 = 0x21;
      local_10c = 1;
      local_118 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)local_98._8_8_;
      SVInt::clearUnusedBits((SVInt *)&local_118);
      SVInt::operator%((SVInt *)&local_138,(SVInt *)&local_f8);
      SVInt::operator=((SVInt *)&local_108,(SVInt *)&local_138);
      if (((0x40 < local_130) || ((local_12c & 0x100) != 0)) &&
         ((EvalContext *)local_138.val != (EvalContext *)0x0)) {
        operator_delete__(local_138.pVal);
      }
      if (((0x40 < local_110) || ((local_10c & 0x100) != 0)) &&
         ((EnumValueSymbol *)local_118.val != (EnumValueSymbol *)0x0)) {
        operator_delete__(local_118.pVal);
      }
      oVar6 = SVInt::as<unsigned_int>((SVInt *)&local_108);
      if (((ulong)oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
        std::__throw_bad_optional_access();
      }
      __rhs = (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               *)EnumValueSymbol::getValue
                           (*(EnumValueSymbol **)
                             (local_98._0_8_ +
                             ((ulong)oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload
                                     .super__Optional_payload_base<unsigned_int> & 0xffffffff) * 8),
                            (SourceRange)ZEXT816(0));
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)__return_storage_ptr__,__rhs);
      if (((0x40 < local_f0) || ((local_eb & 1) != 0)) && ((void *)local_f8.val != (void *)0x0)) {
        operator_delete__(local_f8.pVal);
      }
      if (((0x40 < local_120) || ((local_11c & 0x100) != 0)) &&
         ((EnumValueSymbol *)local_128.val != (EnumValueSymbol *)0x0)) {
        operator_delete__(local_128.pVal);
      }
    }
LAB_003f0e8a:
    if ((void *)local_98._0_8_ != (void *)((long)&local_98 + 0x18)) {
      operator_delete((void *)local_98._0_8_);
    }
  }
  if (((0x40 < local_100) || ((local_fb & 1) != 0)) && ((void *)local_108.val != (void *)0x0)) {
    operator_delete__(local_108.pVal);
  }
  if (((0x40 < local_e0) || ((local_dc & 0x100) != 0)) && ((void *)local_e8.val != (void *)0x0)) {
    operator_delete__(local_e8.pVal);
  }
LAB_003f0ede:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_58);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto val = args[0]->eval(context);
        if (!val)
            return nullptr;

        // Count defaults to 1, but can optionally be passed in.
        SVInt one(33, 1, true);
        SVInt count = one;
        if (args.size() == 2) {
            auto countCv = args[1]->eval(context);
            if (!countCv)
                return nullptr;

            // Convert to a signed 33-bit number for delta computation.
            count = countCv.integer();
            count = count.resize(33);
            count.setSigned(true);
        }

        std::optional<size_t> foundIndex;
        SmallVector<const EnumValueSymbol*> values;
        const EnumType& type = args[0]->type->getCanonicalType().as<EnumType>();
        auto& targetInt = val.integer();

        // Get all values into an array for easier handling. Along the way,
        // try to find the current value among the enum members.
        size_t current = 0;
        for (auto& enumerand : type.values()) {
            auto& cv = enumerand.getValue();
            if (!cv)
                return nullptr;

            if (cv.integer() == targetInt)
                foundIndex = current;

            values.push_back(&enumerand);
            current++;
        }

        if (values.empty())
            return nullptr;

        // If the current value is not in the set of enumerands, the spec
        // says we should return the default value.
        if (!foundIndex.has_value())
            return type.getDefaultValue();

        if (!next)
            count = -count;

        // Handle wraparound for both zero and the size of the array.
        SVInt size(33, values.size(), true);
        SVInt offset = SVInt(33, *foundIndex, true) + count;
        offset += (one - offset / size) * size;

        count = offset % SVInt(33, values.size(), true);
        uint32_t i = count.as<uint32_t>().value();
        return values[i]->getValue();
    }